

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void __thiscall Eigen::internal::CacheSizes::CacheSizes(CacheSizes *this)

{
  ptrdiff_t pVar1;
  int local_1c;
  int local_18;
  int l3CacheSize;
  int l2CacheSize;
  int l1CacheSize;
  CacheSizes *this_local;
  
  this->m_l1 = -1;
  this->m_l2 = -1;
  this->m_l3 = -1;
  _l2CacheSize = this;
  queryCacheSizes(&l3CacheSize,&local_18,&local_1c);
  pVar1 = manage_caching_sizes_helper((long)l3CacheSize,0x8000);
  this->m_l1 = pVar1;
  pVar1 = manage_caching_sizes_helper((long)local_18,0x40000);
  this->m_l2 = pVar1;
  pVar1 = manage_caching_sizes_helper((long)local_1c,0x200000);
  this->m_l3 = pVar1;
  return;
}

Assistant:

CacheSizes(): m_l1(-1),m_l2(-1),m_l3(-1) {
    int l1CacheSize, l2CacheSize, l3CacheSize;
    queryCacheSizes(l1CacheSize, l2CacheSize, l3CacheSize);
    m_l1 = manage_caching_sizes_helper(l1CacheSize, defaultL1CacheSize);
    m_l2 = manage_caching_sizes_helper(l2CacheSize, defaultL2CacheSize);
    m_l3 = manage_caching_sizes_helper(l3CacheSize, defaultL3CacheSize);
  }